

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

bool __thiscall TypeInfo::testComplexTypes(TypeInfo *this)

{
  XMLCh XVar1;
  XMLCh XVar2;
  wchar16 wVar3;
  wchar16 wVar4;
  DOMElement *pDVar5;
  long *plVar6;
  wchar16 *pwVar7;
  XMLCh *pXVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  long *plVar13;
  XMLCh *pXVar14;
  wchar16 *pwVar15;
  bool bVar16;
  bool bVar17;
  XStr local_50;
  XStr local_48;
  XStr local_40;
  XStr local_38;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  local_50.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar5 = findElement(this,local_50.fUnicodeForm);
  XStr::~XStr(&local_50);
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_50.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar16 = true;
  if (pwVar7 != local_50.fUnicodeForm) {
    pwVar15 = local_50.fUnicodeForm;
    if (local_50.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_50.fUnicodeForm != (wchar16 *)0x0) goto LAB_00116a27;
      }
      else {
        bVar16 = *pwVar7 == L'\0';
        if ((local_50.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00116a27:
          bVar16 = *pwVar15 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00116a27;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar15;
        pwVar15 = pwVar15 + 1;
      } while (wVar3 == wVar4);
      bVar16 = false;
    }
  }
  if (bVar16) {
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar8 != local_38.fUnicodeForm) {
      pXVar14 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) {
          if (local_38.fUnicodeForm != (XMLCh *)0x0) goto LAB_00116abe;
        }
        else {
          tmp = *pXVar8 == L'\0';
          if ((local_38.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_00116abe:
            tmp = *pXVar14 == L'\0';
          }
        }
      }
      else {
        do {
          XVar1 = *pXVar8;
          if (XVar1 == L'\0') goto LAB_00116abe;
          pXVar8 = pXVar8 + 1;
          XVar2 = *pXVar14;
          pXVar14 = pXVar14 + 1;
        } while (XVar1 == XVar2);
        tmp = false;
      }
    }
    if (bVar16) {
      XStr::~XStr(&local_38);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_50);
  bVar16 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1de);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("complexTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_50.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_48.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_48);
    XStr::~XStr(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00116c98:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00116c98;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00116d3f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x1d8))(pDVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00116d3f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  plVar6 = (long *)(**(code **)(*(long *)pDVar5 + 0x50))(pDVar5);
  plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
  pXVar8 = (XMLCh *)(**(code **)(*plVar13 + 0x10))(plVar13);
  local_50.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexDerTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar17 = true;
  if (pXVar8 != local_50.fUnicodeForm) {
    pXVar14 = local_50.fUnicodeForm;
    if (local_50.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
      if (pXVar8 == (XMLCh *)0x0) {
        if (local_50.fUnicodeForm != (XMLCh *)0x0) goto LAB_00116e31;
      }
      else {
        bVar17 = *pXVar8 == L'\0';
        if ((local_50.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_00116e31:
          bVar17 = *pXVar14 == L'\0';
        }
      }
    }
    else {
      do {
        XVar1 = *pXVar8;
        if (XVar1 == L'\0') goto LAB_00116e31;
        pXVar8 = pXVar8 + 1;
        XVar2 = *pXVar14;
        pXVar14 = pXVar14 + 1;
      } while (XVar1 == XVar2);
      bVar17 = false;
    }
  }
  if (bVar17) {
    plVar13 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x18))(plVar13);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_48.fUnicodeForm) {
      pwVar15 = local_48.fUnicodeForm;
      if (local_48.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_48.fUnicodeForm != (wchar16 *)0x0) goto LAB_00116eca;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_48.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00116eca:
            tmp = *pwVar15 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_00116eca;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar15;
          pwVar15 = pwVar15 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar17) {
      XStr::~XStr(&local_48);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_50);
  if (tmp != false) {
    return bVar16;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1e1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nExpected values : typename \'",0x1d);
  local_50.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("complexDerTestType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_50.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  XStr::~XStr(&local_40);
  XStr::~XStr(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
  lVar12 = (**(code **)(*plVar13 + 0x10))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
LAB_001170a1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
  }
  else {
    plVar13 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    pwVar7 = (wchar16 *)(**(code **)(*plVar13 + 0x10))(plVar13);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 != (char *)0x0) {
      sVar11 = strlen(pcVar10);
      goto LAB_001170a1;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar13 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
  lVar12 = (**(code **)(*plVar13 + 0x18))(plVar13);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_00117165;
    }
    sVar11 = strlen(pcVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
LAB_00117165:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testComplexTypes() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning

    //element complexTest
    DOMElement *testEle = findElement(X("complexTest"));
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexTestType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexDerTestType"), X(""), __LINE__);
    return passed;
}